

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O3

void __thiscall MT32Emu::TVF::reset(TVF *this,PartialParam *newPartialParam,uint basePitch)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Poly *pPVar4;
  Tables *pTVar5;
  Synth *pSVar6;
  int iVar7;
  int iVar8;
  Bit8u BVar9;
  int iVar10;
  uint uVar11;
  Bit8u target;
  bool bVar12;
  
  this->partialParam = newPartialParam;
  pPVar4 = Partial::getPoly(this->partial);
  uVar2 = Poly::getKey(pPVar4);
  pPVar4 = Partial::getPoly(this->partial);
  uVar3 = Poly::getVelocity(pPVar4);
  pTVar5 = Tables::getInstance();
  pSVar6 = Partial::getSynth(this->partial);
  iVar8 = uVar2 - 0x3c;
  iVar7 = ((int)(char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                      ::keyfollowMult21[(newPartialParam->tvf).keyfollow] -
          (int)(char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                     ::keyfollowMult21[(newPartialParam->wg).pitchKeyfollow]) * iVar8;
  bVar1 = (newPartialParam->tvf).biasPoint;
  iVar10 = bVar1 - uVar2;
  if ((bVar1 & 0x40) == 0) {
    iVar10 = iVar10 + 0x21;
    if (0 < iVar10) {
      iVar7 = iVar7 - iVar10 * (char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                                     ::biasLevelToBiasMult[(newPartialParam->tvf).biasLevel];
    }
  }
  else {
    iVar10 = iVar10 + -0x1f;
    if (iVar10 < 0) {
      iVar7 = iVar7 + iVar10 * (char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                                     ::biasLevelToBiasMult[(newPartialParam->tvf).biasLevel];
    }
  }
  uVar2 = ((uint)(newPartialParam->tvf).cutoff * 0x10 + iVar7) - 800;
  if ((int)uVar2 < 0) {
    if (((uint)*pSVar6->controlROMFeatures & 0x40) == 0) {
      bVar12 = uVar2 < 0xfffff801;
      uVar11 = 0xfffff800;
    }
    else {
      bVar12 = uVar2 < 0xfffffc01;
      uVar11 = 0xfffffe70;
    }
    if (!bVar12) {
      uVar11 = uVar2;
    }
  }
  else {
    iVar10 = uVar2 + (basePitch >> 4) + -0xe00;
    iVar7 = 0;
    if (0 < iVar10) {
      iVar7 = iVar10;
    }
    uVar11 = uVar2 - iVar7;
  }
  iVar7 = (int)(uVar11 + 0x808) >> 4;
  BVar9 = (Bit8u)iVar7;
  if (0xfe < iVar7) {
    BVar9 = 0xff;
  }
  this->baseCutoff = BVar9;
  uVar2 = (uint)(newPartialParam->tvf).envVeloSensitivity;
  iVar7 = (((int)(uVar3 * uVar2) >> 6) - uVar2) +
          (iVar8 >> (4 - (newPartialParam->tvf).envDepthKeyfollow & 0x1f)) + 0x6d;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  uVar2 = (uint)(newPartialParam->tvf).envDepth * iVar7 >> 6;
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  this->levelMult = uVar2;
  BVar9 = (newPartialParam->tvf).envTimeKeyfollow;
  iVar8 = iVar8 >> (5 - BVar9 & 0x1f);
  if (BVar9 == '\0') {
    iVar8 = 0;
  }
  this->keyTimeSubtraction = iVar8;
  uVar2 = (newPartialParam->tvf).envLevel[0] * uVar2;
  uVar3 = (uint)(newPartialParam->tvf).envTime[0];
  iVar7 = uVar3 - iVar8;
  if (iVar7 == 0 || (int)uVar3 < iVar8) {
    BVar9 = 0xff;
  }
  else {
    iVar7 = (uint)pTVar5->envLogarithmicTime[uVar2 >> 8] - iVar7;
    iVar8 = 1;
    if (1 < iVar7) {
      iVar8 = iVar7;
    }
    BVar9 = (Bit8u)iVar8;
  }
  LA32Ramp::reset(this->cutoffModifierRamp);
  target = (Bit8u)(uVar2 >> 8);
  this->target = target;
  this->phase = 1;
  LA32Ramp::startRamp(this->cutoffModifierRamp,target,BVar9);
  return;
}

Assistant:

void TVF::reset(const TimbreParam::PartialParam *newPartialParam, unsigned int basePitch) {
	partialParam = newPartialParam;

	unsigned int key = partial->getPoly()->getKey();
	unsigned int velocity = partial->getPoly()->getVelocity();

	const Tables *tables = &Tables::getInstance();

	baseCutoff = calcBaseCutoff(newPartialParam, basePitch, key, partial->getSynth()->controlROMFeatures->quirkTVFBaseCutoffLimit);
#if MT32EMU_MONITOR_TVF >= 1
	partial->getSynth()->printDebug("[+%lu] [Partial %d] TVF,base,%d", partial->debugGetSampleNum(), partial->debugGetPartialNum(), baseCutoff);
#endif

	int newLevelMult = velocity * newPartialParam->tvf.envVeloSensitivity;
	newLevelMult >>= 6;
	newLevelMult += 109 - newPartialParam->tvf.envVeloSensitivity;
	newLevelMult += (signed(key) - 60) >> (4 - newPartialParam->tvf.envDepthKeyfollow);
	if (newLevelMult < 0) {
		newLevelMult = 0;
	}
	newLevelMult *= newPartialParam->tvf.envDepth;
	newLevelMult >>= 6;
	if (newLevelMult > 255) {
		newLevelMult = 255;
	}
	levelMult = newLevelMult;

	if (newPartialParam->tvf.envTimeKeyfollow != 0) {
		keyTimeSubtraction = (signed(key) - 60) >> (5 - newPartialParam->tvf.envTimeKeyfollow);
	} else {
		keyTimeSubtraction = 0;
	}

	int newTarget = (newLevelMult * newPartialParam->tvf.envLevel[0]) >> 8;
	int envTimeSetting = newPartialParam->tvf.envTime[0] - keyTimeSubtraction;
	int newIncrement;
	if (envTimeSetting <= 0) {
		newIncrement = (0x80 | 127);
	} else {
		newIncrement = tables->envLogarithmicTime[newTarget] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
	}
	cutoffModifierRamp->reset();
	startRamp(newTarget, newIncrement, PHASE_2 - 1);
}